

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

int __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::copy
          (TypedAttribute<Imf_2_5::ChannelList> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TypedAttribute<Imf_2_5::ChannelList> *this_00;
  
  this_00 = (TypedAttribute<Imf_2_5::ChannelList> *)operator_new(0x38);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  *(undefined8 *)&(this_00->_value)._map._M_t._M_impl = 0;
  *(undefined8 *)&(this_00->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this_00->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->_value)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  TypedAttribute(this_00);
  (*(this_00->super_Attribute)._vptr_Attribute[6])(this_00,this);
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}